

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O2

void skiwi::compile_leq_2(asmcode *code,compiler_options *ops)

{
  skiwi *psVar1;
  uint64_t lab;
  uint64_t lab_00;
  uint64_t lab_01;
  uint64_t lab_02;
  uint64_t lab_03;
  operand local_ec [3];
  string local_e0;
  string error;
  string done;
  string l1;
  string l3;
  string l2;
  
  l1._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,char_const(&)[8]>
            (code,(operation *)&l1,(char (*) [8])"L_leq_2");
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&l1,psVar1,lab);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&l2,psVar1,lab_00);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&l3,psVar1,lab_01);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&done,psVar1,lab_02);
  psVar1 = label;
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  if (ops->safe_primitives == true) {
    label = label + 1;
    label_to_string_abi_cxx11_(&local_e0,psVar1,lab_03);
    std::__cxx11::string::operator=((string *)&error,(string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  local_e0._M_dataplus._M_p._0_4_ = 0x5a;
  local_ec[0] = RAX;
  local_ec[1] = 0x39;
  local_ec[2] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_e0,local_ec,local_ec + 1,(int *)(local_ec + 2));
  if (ops->safe_primitives == true) {
    local_e0._M_dataplus._M_p._0_4_ = 0x2f;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_e0,&l1);
  }
  else {
    local_e0._M_dataplus._M_p._0_4_ = 0x38;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_e0,&l1);
  }
  local_e0._M_dataplus._M_p._0_4_ = 0x5a;
  local_ec[0] = RBX;
  local_ec[1] = 0x39;
  local_ec[2] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_e0,local_ec,local_ec + 1,(int *)(local_ec + 2));
  if (ops->safe_primitives == true) {
    local_e0._M_dataplus._M_p._0_4_ = 0x2f;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_e0,&l3);
  }
  else {
    local_e0._M_dataplus._M_p._0_4_ = 0x38;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_e0,&l3);
  }
  if (ops->safe_primitives == true) {
    local_e0._M_dataplus._M_p._0_4_ = 0x4b;
    local_ec[0] = R11;
    assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
              (code,(operation *)&local_e0,local_ec);
    jump_if_arg_is_not_block(code,RAX,R11,&error);
    jump_if_arg_is_not_block(code,RBX,R11,&error);
  }
  local_ec[0] = AH;
  local_ec[1] = 9;
  local_ec[2] = 0x39;
  local_e0._M_dataplus._M_p = (pointer)0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_ec,local_ec + 1,local_ec + 2,(unsigned_long *)&local_e0);
  local_ec[0] = AH;
  local_ec[1] = 10;
  local_ec[2] = 0x39;
  local_e0._M_dataplus._M_p = (pointer)0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_ec,local_ec + 1,local_ec + 2,(unsigned_long *)&local_e0);
  if (ops->safe_primitives == true) {
    jump_if_arg_does_not_point_to_flonum(code,RAX,R11,&error);
    jump_if_arg_does_not_point_to_flonum(code,RBX,R11,&error);
    local_e0._M_dataplus._M_p._0_4_ = 0x4a;
    local_ec[0] = R11;
    assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
              (code,(operation *)&local_e0,local_ec);
  }
  local_e0._M_dataplus._M_p._0_4_ = 0x43;
  local_ec[1] = 0x19;
  local_ec[2] = 8;
  local_ec[0] = XMM0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_e0,local_ec,local_ec + 1,(int *)(local_ec + 2));
  local_e0._M_dataplus._M_p._0_4_ = 0x43;
  local_ec[0] = XMM1;
  local_ec[1] = 0x1a;
  local_ec[2] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_e0,local_ec,local_ec + 1,(int *)(local_ec + 2));
  local_e0._M_dataplus._M_p._0_4_ = 8;
  local_ec[0] = XMM0;
  local_ec[1] = 0x44;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_e0,local_ec,local_ec + 1);
  local_e0._M_dataplus._M_p._0_4_ = 0x42;
  local_ec[0] = RAX;
  local_ec[1] = 0x43;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_e0,local_ec,local_ec + 1);
  local_e0._M_dataplus._M_p._0_4_ = 0x49;
  local_ec[0] = RBX;
  local_ec[1] = 0x39;
  local_ec[2] = 5;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_e0,local_ec,local_ec + 1,(int *)(local_ec + 2));
  if (ops->safe_primitives == true) {
    local_e0._M_dataplus._M_p._0_4_ = 0x2c;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_e0,&done);
  }
  else {
    local_e0._M_dataplus._M_p._0_4_ = 0x35;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_e0,&done);
  }
  local_e0._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_e0,&l1);
  local_e0._M_dataplus._M_p._0_4_ = 0x5a;
  local_ec[0] = RBX;
  local_ec[1] = 0x39;
  local_ec[2] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_e0,local_ec,local_ec + 1,(int *)(local_ec + 2));
  local_e0._M_dataplus._M_p._0_4_ = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_e0,&l2);
  fix2int(code,RAX);
  local_e0._M_dataplus._M_p._0_4_ = 0xb;
  local_ec[0] = XMM0;
  local_ec[1] = 9;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_e0,local_ec,local_ec + 1);
  if (ops->safe_primitives == true) {
    local_e0._M_dataplus._M_p._0_4_ = 0x4b;
    local_ec[0] = R11;
    assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
              (code,(operation *)&local_e0,local_ec);
    jump_if_arg_is_not_block(code,RBX,R11,&error);
  }
  local_ec[0] = AH;
  local_ec[1] = 10;
  local_ec[2] = 0x39;
  local_e0._M_dataplus._M_p = (pointer)0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_ec,local_ec + 1,local_ec + 2,(unsigned_long *)&local_e0);
  if (ops->safe_primitives == true) {
    jump_if_arg_does_not_point_to_flonum(code,RBX,R11,&error);
    local_e0._M_dataplus._M_p._0_4_ = 0x4a;
    local_ec[0] = R11;
    assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
              (code,(operation *)&local_e0,local_ec);
  }
  local_e0._M_dataplus._M_p._0_4_ = 0x43;
  local_ec[0] = XMM1;
  local_ec[1] = 0x1a;
  local_ec[2] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_e0,local_ec,local_ec + 1,(int *)(local_ec + 2));
  local_e0._M_dataplus._M_p._0_4_ = 8;
  local_ec[0] = XMM0;
  local_ec[1] = 0x44;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_e0,local_ec,local_ec + 1);
  local_e0._M_dataplus._M_p._0_4_ = 0x42;
  local_ec[0] = RAX;
  local_ec[1] = 0x43;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_e0,local_ec,local_ec + 1);
  local_e0._M_dataplus._M_p._0_4_ = 0x49;
  local_ec[0] = RBX;
  local_ec[1] = 0x39;
  local_ec[2] = 5;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_e0,local_ec,local_ec + 1,(int *)(local_ec + 2));
  local_e0._M_dataplus._M_p._0_4_ = 0x35;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_e0,&done);
  local_e0._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_e0,&l2);
  local_e0._M_dataplus._M_p._0_4_ = 5;
  local_ec[0] = RAX;
  local_ec[1] = 10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_e0,local_ec,local_ec + 1);
  local_e0._M_dataplus._M_p._0_4_ = 0x53;
  local_ec[0] = AL;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_e0,local_ec);
  local_e0._M_dataplus._M_p._0_4_ = 0x44;
  local_ec[0] = RAX;
  local_ec[1] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_e0,local_ec,local_ec + 1);
  local_e0._M_dataplus._M_p._0_4_ = 0x35;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_e0,&done);
  local_e0._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_e0,&l3);
  if (ops->safe_primitives == true) {
    local_e0._M_dataplus._M_p._0_4_ = 0x4b;
    local_ec[0] = R11;
    assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
              (code,(operation *)&local_e0,local_ec);
    jump_short_if_arg_is_not_block(code,RAX,R11,&error);
  }
  local_ec[0] = AH;
  local_ec[1] = 9;
  local_ec[2] = 0x39;
  local_e0._M_dataplus._M_p = (pointer)0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_ec,local_ec + 1,local_ec + 2,(unsigned_long *)&local_e0);
  if (ops->safe_primitives == true) {
    jump_short_if_arg_does_not_point_to_flonum(code,RAX,R11,&error);
    local_e0._M_dataplus._M_p._0_4_ = 0x4a;
    local_ec[0] = R11;
    assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
              (code,(operation *)&local_e0,local_ec);
  }
  local_e0._M_dataplus._M_p._0_4_ = 0x43;
  local_ec[1] = 0x19;
  local_ec[2] = 8;
  local_ec[0] = XMM0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_e0,local_ec,local_ec + 1,(int *)(local_ec + 2));
  fix2int(code,RBX);
  local_e0._M_dataplus._M_p._0_4_ = 0xb;
  local_ec[0] = XMM1;
  local_ec[1] = 10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_e0,local_ec,local_ec + 1);
  int2fix(code,RBX);
  local_e0._M_dataplus._M_p._0_4_ = 8;
  local_ec[0] = XMM0;
  local_ec[1] = 0x44;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_e0,local_ec,local_ec + 1);
  local_e0._M_dataplus._M_p._0_4_ = 0x42;
  local_ec[0] = RAX;
  local_ec[1] = 0x43;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_e0,local_ec,local_ec + 1);
  local_e0._M_dataplus._M_p._0_4_ = 0x35;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_e0,&done);
  local_e0._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_e0,&done);
  local_e0._M_dataplus._M_p._0_4_ = 2;
  local_ec[0] = RAX;
  local_ec[1] = 0x39;
  local_ec[2] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_e0,local_ec,local_ec + 1,(int *)(local_ec + 2));
  local_e0._M_dataplus._M_p._0_4_ = 0x55;
  local_ec[0] = RAX;
  local_ec[1] = 0x39;
  local_ec[2] = 3;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_e0,local_ec,local_ec + 1,(int *)(local_ec + 2));
  local_e0._M_dataplus._M_p._0_4_ = 0x49;
  local_ec[0] = RAX;
  local_ec[1] = 0x39;
  local_ec[2] = 7;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_e0,local_ec,local_ec + 1,(int *)(local_ec + 2));
  local_e0._M_dataplus._M_p._0_4_ = 0x4c;
  assembler::asmcode::add<assembler::asmcode::operation>(code,(operation *)&local_e0);
  if (ops->safe_primitives == true) {
    error_label(code,&error,re_leq_contract_violation);
  }
  std::__cxx11::string::~string((string *)&error);
  std::__cxx11::string::~string((string *)&done);
  std::__cxx11::string::~string((string *)&l3);
  std::__cxx11::string::~string((string *)&l2);
  std::__cxx11::string::~string((string *)&l1);
  return;
}

Assistant:

void compile_leq_2(asmcode& code, const compiler_options& ops)
  {
  code.add(asmcode::LABEL, "L_leq_2");
  auto l1 = label_to_string(label++);
  auto l2 = label_to_string(label++);
  auto l3 = label_to_string(label++);
  auto done = label_to_string(label++);
  std::string error;
  if (ops.safe_primitives)
    error = label_to_string(label++);
  code.add(asmcode::TEST, asmcode::RAX, asmcode::NUMBER, 1);
  if (ops.safe_primitives)
    code.add(asmcode::JE, l1);
  else
    code.add(asmcode::JES, l1); // rax is fixnum
  //rax is flonum
  code.add(asmcode::TEST, asmcode::RBX, asmcode::NUMBER, 1);
  if (ops.safe_primitives)
    code.add(asmcode::JE, l3); // rax is flonum and rbx is fixnum
  else
    code.add(asmcode::JES, l3); // rax is flonum and rbx is fixnum
  // rax and rbx are flonum
  // here check whether they are a block
  if (ops.safe_primitives)
    {
    code.add(asmcode::PUSH, asmcode::R11);
    jump_if_arg_is_not_block(code, asmcode::RAX, asmcode::R11, error);
    jump_if_arg_is_not_block(code, asmcode::RBX, asmcode::R11, error);
    }
  code.add(asmcode::AND, asmcode::RAX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  code.add(asmcode::AND, asmcode::RBX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  // check whether they contain flonums
  if (ops.safe_primitives)
    {
    jump_if_arg_does_not_point_to_flonum(code, asmcode::RAX, asmcode::R11, error);
    jump_if_arg_does_not_point_to_flonum(code, asmcode::RBX, asmcode::R11, error);
    code.add(asmcode::POP, asmcode::R11);
    }
  code.add(asmcode::MOVSD, asmcode::XMM0, asmcode::MEM_RAX, CELLS(1));
  code.add(asmcode::MOVSD, asmcode::XMM1, asmcode::MEM_RBX, CELLS(1));
  code.add(asmcode::CMPLEPD, asmcode::XMM0, asmcode::XMM1);
  code.add(asmcode::MOVMSKPD, asmcode::RAX, asmcode::XMM0);
  code.add(asmcode::OR, asmcode::RBX, asmcode::NUMBER, block_tag);
  if (ops.safe_primitives)
    code.add(asmcode::JMP, done);
  else
    code.add(asmcode::JMPS, done);
  code.add(asmcode::LABEL, l1);
  code.add(asmcode::TEST, asmcode::RBX, asmcode::NUMBER, 1);
  code.add(asmcode::JES, l2); // rax and rbx are fixnum
  // rax is fixnum and rbx is flonum
  fix2int(code, asmcode::RAX);
  code.add(asmcode::CVTSI2SD, asmcode::XMM0, asmcode::RAX);
  // here check whether RBX is a block
  if (ops.safe_primitives)
    {
    code.add(asmcode::PUSH, asmcode::R11);
    jump_if_arg_is_not_block(code, asmcode::RBX, asmcode::R11, error);
    }
  code.add(asmcode::AND, asmcode::RBX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  if (ops.safe_primitives)
    {
    jump_if_arg_does_not_point_to_flonum(code, asmcode::RBX, asmcode::R11, error);
    code.add(asmcode::POP, asmcode::R11);
    }
  code.add(asmcode::MOVSD, asmcode::XMM1, asmcode::MEM_RBX, CELLS(1));
  code.add(asmcode::CMPLEPD, asmcode::XMM0, asmcode::XMM1);
  code.add(asmcode::MOVMSKPD, asmcode::RAX, asmcode::XMM0);
  code.add(asmcode::OR, asmcode::RBX, asmcode::NUMBER, block_tag);
  code.add(asmcode::JMPS, done);
  code.add(asmcode::LABEL, l2);
  code.add(asmcode::CMP, asmcode::RAX, asmcode::RBX);
  code.add(asmcode::SETLE, asmcode::AL);
  code.add(asmcode::MOVZX, asmcode::RAX, asmcode::AL);
  code.add(asmcode::JMPS, done);

  code.add(asmcode::LABEL, l3);
  // rax is flonum and rbx is fixnum
  // here check whether RAX is a block
  if (ops.safe_primitives)
    {
    code.add(asmcode::PUSH, asmcode::R11);
    jump_short_if_arg_is_not_block(code, asmcode::RAX, asmcode::R11, error);
    }
  code.add(asmcode::AND, asmcode::RAX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  if (ops.safe_primitives)
    {
    jump_short_if_arg_does_not_point_to_flonum(code, asmcode::RAX, asmcode::R11, error);
    code.add(asmcode::POP, asmcode::R11);
    }
  code.add(asmcode::MOVSD, asmcode::XMM0, asmcode::MEM_RAX, CELLS(1));
  fix2int(code, asmcode::RBX);
  code.add(asmcode::CVTSI2SD, asmcode::XMM1, asmcode::RBX);
  int2fix(code, asmcode::RBX);
  code.add(asmcode::CMPLEPD, asmcode::XMM0, asmcode::XMM1);
  code.add(asmcode::MOVMSKPD, asmcode::RAX, asmcode::XMM0);
  code.add(asmcode::JMPS, done);
  code.add(asmcode::LABEL, done);
  code.add(asmcode::AND, asmcode::RAX, asmcode::NUMBER, 1);
  code.add(asmcode::SHL, asmcode::RAX, asmcode::NUMBER, 3);
  code.add(asmcode::OR, asmcode::RAX, asmcode::NUMBER, bool_f);
  code.add(asmcode::RET);
  if (ops.safe_primitives)
    {
    error_label(code, error, re_leq_contract_violation);
    }
  }